

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

TargetType __thiscall
cmExportBuildFileGenerator::GetExportTargetType
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *target)

{
  uint uVar1;
  cmGlobalGenerator *pcVar2;
  TargetType local_1c;
  TargetType targetType;
  cmGeneratorTarget *target_local;
  cmExportBuildFileGenerator *this_local;
  
  local_1c = cmGeneratorTarget::GetType(target);
  if (local_1c == OBJECT_LIBRARY) {
    pcVar2 = cmLocalGenerator::GetGlobalGenerator(this->LG);
    uVar1 = (*pcVar2->_vptr_cmGlobalGenerator[0x25])(pcVar2,0);
    if ((uVar1 & 1) == 0) {
      local_1c = INTERFACE_LIBRARY;
    }
  }
  return local_1c;
}

Assistant:

cmStateEnums::TargetType cmExportBuildFileGenerator::GetExportTargetType(
  cmGeneratorTarget const* target) const
{
  cmStateEnums::TargetType targetType = target->GetType();
  // An object library exports as an interface library if we cannot
  // tell clients where to find the objects.  This is sufficient
  // to support transitive usage requirements on other targets that
  // use the object library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      !this->LG->GetGlobalGenerator()->HasKnownObjectFileLocation(nullptr)) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}